

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::ProcessorProperty::ProcessorProperty
          (ProcessorProperty *this,CodeLocation *l,Property prop)

{
  CodeLocation local_28;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  local_28.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Expression::Expression(&this->super_Expression,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__ProcessorProperty_002fb158;
  this->property = prop;
  (this->type).boundingSize = 0;
  (this->type).arrayElementBoundingSize = 0;
  (this->type).structure.object = (Structure *)0x0;
  (this->type).category = primitive;
  (this->type).arrayElementCategory = invalid;
  (this->type).isRef = false;
  (this->type).isConstant = false;
  (this->type).primitiveType.type = (uint)(prop - id < 3) * 4 + float64;
  return;
}

Assistant:

ProcessorProperty (CodeLocation l, Property prop)
            : Expression (std::move (l)), property (prop),
              type (getPropertyType (prop))
        {
        }